

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

void pdf_drop_obj(hd_context *ctx,pdf_obj *obj)

{
  int iVar1;
  pdf_obj *obj_local;
  hd_context *ctx_local;
  
  if (((pdf_obj *)0x188 < obj) && (iVar1 = hd_drop_imp16(ctx,obj,&obj->refs), iVar1 != 0)) {
    if (obj->kind == 'a') {
      pdf_drop_array(ctx,obj);
    }
    else if (obj->kind == 'd') {
      pdf_drop_dict(ctx,obj);
    }
    else {
      hd_free(ctx,obj);
    }
  }
  return;
}

Assistant:

void
pdf_drop_obj(hd_context *ctx, pdf_obj *obj)
{
    if (obj >= PDF_OBJ__LIMIT)
    {
        if (hd_drop_imp16(ctx, obj, &obj->refs))
        {
            if (obj->kind == PDF_ARRAY)
                pdf_drop_array(ctx, obj);
            else if (obj->kind == PDF_DICT)
                pdf_drop_dict(ctx, obj);
            else
                hd_free(ctx, obj);
        }
    }
}